

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::AdapterPromiseNode<unsigned_int,kj::_::PromiseAndFulfillerAdapter<unsigned_int>>::
AdapterPromiseNode<kj::_::WeakFulfiller<unsigned_int>&>
          (AdapterPromiseNode<unsigned_int,kj::_::PromiseAndFulfillerAdapter<unsigned_int>> *this,
          WeakFulfiller<unsigned_int> *params)

{
  WeakFulfiller<unsigned_int> *wrapper;
  WeakFulfiller<unsigned_int> *params_local;
  AdapterPromiseNode<unsigned_int,_kj::_::PromiseAndFulfillerAdapter<unsigned_int>_> *this_local;
  
  AdapterPromiseNodeBase::AdapterPromiseNodeBase((AdapterPromiseNodeBase *)this);
  PromiseFulfiller<unsigned_int>::PromiseFulfiller((PromiseFulfiller<unsigned_int> *)(this + 0x18));
  *(undefined ***)this = &PTR_destroy_00bf5588;
  *(undefined ***)(this + 0x18) = &PTR_reject_00bf55d8;
  ExceptionOr<unsigned_int>::ExceptionOr((ExceptionOr<unsigned_int> *)(this + 0x20));
  this[0x1c0] = (AdapterPromiseNode<unsigned_int,kj::_::PromiseAndFulfillerAdapter<unsigned_int>>)
                0x1;
  wrapper = fwd<kj::_::WeakFulfiller<unsigned_int>&>(params);
  PromiseAndFulfillerAdapter<unsigned_int>::PromiseAndFulfillerAdapter
            ((PromiseAndFulfillerAdapter<unsigned_int> *)(this + 0x1c8),
             (PromiseFulfiller<unsigned_int> *)(this + 0x18),wrapper);
  return;
}

Assistant:

AdapterPromiseNode(Params&&... params)
      : adapter(static_cast<PromiseFulfiller<UnfixVoid<T>>&>(*this), kj::fwd<Params>(params)...) {}